

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O0

int fe_parse_general_params(cmd_ln_t *config,fe_t *fe)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ps_config_t *ppVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  double dVar8;
  int window_samples;
  int frate;
  int j;
  fe_t *fe_local;
  cmd_ln_t *config_local;
  
  ppVar4 = ps_config_retain(config);
  fe->config = ppVar4;
  lVar5 = ps_config_int(config,"samprate");
  fe->sampling_rate = (float32)(float)lVar5;
  uVar6 = ps_config_int(config,"frate");
  iVar3 = (int)uVar6;
  if (((0x7fff < iVar3) ||
      ((float)fe->sampling_rate <= (float)iVar3 && (float)iVar3 != (float)fe->sampling_rate)) ||
     (iVar3 < 1)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
            ,0x44,"Frame rate %d can not be bigger than sample rate %.02f\n",
            (double)(float)fe->sampling_rate,uVar6 & 0xffffffff);
    config_local._4_4_ = -1;
  }
  else {
    fe->frame_rate = (int16)uVar6;
    iVar1 = ps_config_bool(config,"dither");
    if (iVar1 != 0) {
      fe->dither = '\x01';
      lVar5 = ps_config_int(config,"seed");
      fe->dither_seed = (int32)lVar5;
    }
    pcVar7 = ps_config_str(config,"input_endian");
    iVar1 = strcmp("little",pcVar7);
    fe->swap = (uint8)iVar1;
    dVar8 = ps_config_float(config,"wlen");
    fe->window_length = (float32)(float)dVar8;
    dVar8 = ps_config_float(config,"alpha");
    fe->pre_emphasis_alpha = (float32)(float)dVar8;
    lVar5 = ps_config_int(config,"ncep");
    fe->num_cepstra = (uint8)lVar5;
    lVar5 = ps_config_int(config,"nfft");
    fe->fft_size = (int16)lVar5;
    uVar2 = (uint)((float)fe->window_length * (float)fe->sampling_rate);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
            ,0x5c,"Frames are %d samples at intervals of %d\n",(ulong)uVar2,
            (ulong)(uint)(int)((float)fe->sampling_rate / (float)iVar3));
    if ((int)uVar2 < 0x8000) {
      if (fe->fft_size == 0) {
        fe->fft_order = '\0';
        fe->fft_size = (int16)(1 << (fe->fft_order & 0x1f));
        while ((int)fe->fft_size < (int)uVar2) {
          fe->fft_order = fe->fft_order + '\x01';
          fe->fft_size = fe->fft_size << 1;
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                ,0x6c,"FFT size automatically set to %d\n",(ulong)(uint)(int)fe->fft_size);
      }
      else {
        window_samples = (int)fe->fft_size;
        fe->fft_order = '\0';
        while (1 < window_samples) {
          if ((window_samples % 2 != 0) || (fe->fft_size < 1)) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                    ,0x73,"fft: number of points must be a power of 2 (is %d)\n",
                    (ulong)(uint)(int)fe->fft_size);
            return -1;
          }
          window_samples = window_samples >> 1;
          fe->fft_order = fe->fft_order + '\x01';
        }
        if ((int)fe->fft_size < (int)uVar2) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                  ,0x7a,"FFT: Number of points must be greater or equal to frame size\n");
          return -1;
        }
      }
      iVar3 = ps_config_bool(config,"remove_dc");
      fe->remove_dc = (uint8)iVar3;
      pcVar7 = ps_config_str(config,"transform");
      iVar3 = strcmp(pcVar7,"dct");
      if (iVar3 == 0) {
        fe->transform = '\x01';
      }
      else {
        pcVar7 = ps_config_str(config,"transform");
        iVar3 = strcmp(pcVar7,"legacy");
        if (iVar3 == 0) {
          fe->transform = '\0';
        }
        else {
          pcVar7 = ps_config_str(config,"transform");
          iVar3 = strcmp(pcVar7,"htk");
          if (iVar3 != 0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                    ,0x88,"Invalid transform type (values are \'dct\', \'legacy\', \'htk\')\n");
            return -1;
          }
          fe->transform = '\x02';
        }
      }
      iVar3 = ps_config_bool(config,"logspec");
      if (iVar3 != 0) {
        fe->log_spec = '\x01';
      }
      iVar3 = ps_config_bool(config,"smoothspec");
      if (iVar3 != 0) {
        fe->log_spec = '\x02';
      }
      config_local._4_4_ = 0;
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
              ,0x60,"Frame size exceeds maximum FFT size (%d > %d)\n",(ulong)uVar2,0x7fff);
      config_local._4_4_ = -1;
    }
  }
  return config_local._4_4_;
}

Assistant:

int
fe_parse_general_params(cmd_ln_t *config, fe_t * fe)
{
    int j, frate, window_samples;

    fe->config = ps_config_retain(config);
    fe->sampling_rate = ps_config_int(config, "samprate");
    frate = ps_config_int(config, "frate");
    if (frate > MAX_INT16 || frate > fe->sampling_rate || frate < 1) {
        E_ERROR
            ("Frame rate %d can not be bigger than sample rate %.02f\n",
             frate, fe->sampling_rate);
        return -1;
    }

    fe->frame_rate = (int16)frate;
    if (ps_config_bool(config, "dither")) {
        fe->dither = 1;
        fe->dither_seed = ps_config_int(config, "seed");
    }
#ifdef WORDS_BIGENDIAN
    /* i.e. if input_endian is *not* "big", then fe->swap is true. */
    fe->swap = strcmp("big", ps_config_str(config, "input_endian"));
#else        
    /* and vice versa */
    fe->swap = strcmp("little", ps_config_str(config, "input_endian"));
#endif
    fe->window_length = ps_config_float(config, "wlen");
    fe->pre_emphasis_alpha = ps_config_float(config, "alpha");

    fe->num_cepstra = (uint8)ps_config_int(config, "ncep");
    fe->fft_size = (int16)ps_config_int(config, "nfft");

    window_samples = (int)(fe->window_length * fe->sampling_rate);
    E_INFO("Frames are %d samples at intervals of %d\n",
           window_samples, (int)(fe->sampling_rate / frate));
    if (window_samples > MAX_INT16) {
        /* This is extremely unlikely! */
        E_ERROR("Frame size exceeds maximum FFT size (%d > %d)\n",
                window_samples, MAX_INT16);
        return -1;
    }

    /* Set FFT size automatically from window size. */
    if (fe->fft_size == 0) {
        fe->fft_order = 0;
        fe->fft_size = (1<<fe->fft_order);
        while (fe->fft_size < window_samples) {
            fe->fft_order++;
            fe->fft_size <<= 1;
        }
        E_INFO("FFT size automatically set to %d\n", fe->fft_size);
    }
    else {
        /* Check FFT size, compute FFT order (log_2(n)) */
        for (j = fe->fft_size, fe->fft_order = 0; j > 1; j >>= 1, fe->fft_order++) {
            if (((j % 2) != 0) || (fe->fft_size <= 0)) {
                E_ERROR("fft: number of points must be a power of 2 (is %d)\n",
                        fe->fft_size);
                return -1;
            }
        }
        /* Verify that FFT size is greater or equal to window length. */
        if (fe->fft_size < window_samples) {
            E_ERROR("FFT: Number of points must be greater or "
                    "equal to frame size\n");
            return -1;
        }
    }

    fe->remove_dc = ps_config_bool(config, "remove_dc");

    if (0 == strcmp(ps_config_str(config, "transform"), "dct"))
        fe->transform = DCT_II;
    else if (0 == strcmp(ps_config_str(config, "transform"), "legacy"))
        fe->transform = LEGACY_DCT;
    else if (0 == strcmp(ps_config_str(config, "transform"), "htk"))
        fe->transform = DCT_HTK;
    else {
        E_ERROR("Invalid transform type (values are 'dct', 'legacy', 'htk')\n");
        return -1;
    }

    if (ps_config_bool(config, "logspec"))
        fe->log_spec = RAW_LOG_SPEC;
    if (ps_config_bool(config, "smoothspec"))
        fe->log_spec = SMOOTH_LOG_SPEC;

    return 0;
}